

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

bool __thiscall
Commands::command_handler_register::Handle
          (command_handler_register *this,string *command,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments,Command_Source *from,int alias_depth)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  const_iterator cVar6;
  const_iterator cVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  iterator iVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  _Rb_tree_node_base *p_Var9;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  _Rb_tree_node_base *p_Var10;
  bool bVar11;
  string prefix;
  string local_148;
  uint local_124;
  _Rb_tree_node_base *local_120;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_118;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (command->_M_string_length == 0) {
    iVar5 = (*from->_vptr_Command_Source[4])(from);
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unknown_command","");
    I18N::Format<>(&local_50,(I18N *)(CONCAT44(extraout_var,iVar5) + 0x490),&local_148);
    (*from->_vptr_Command_Source[5])(from,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_00129984;
  }
  else {
    if (100 < alias_depth) {
      Console::Wrn("Command alias nested too deeply or infinitely recursive: %s",
                   (command->_M_dataplus)._M_p);
      return false;
    }
    local_118 = arguments;
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Commands::command_handler>_>_>
                    *)this,command);
    p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
    if (((_Rb_tree_header *)cVar6._M_node == p_Var1) ||
       ((ulong)((long)(local_118->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(local_118->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) <
        (ulong)((long)cVar6._M_node[3]._M_parent - *(long *)(cVar6._M_node + 3)))) {
      cVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->aliases)._M_h,command);
      if (cVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        p_Var9 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var10 = &p_Var1->_M_header;
        while ((_Rb_tree_header *)p_Var9 != p_Var1) {
          local_120 = p_Var10;
          if ((p_Var9[4]._M_left <= (_Base_ptr)command->_M_string_length) &&
             ((_Base_ptr)command->_M_string_length < p_Var9[2]._M_parent)) {
            std::__cxx11::string::substr((ulong)&local_148,(ulong)(p_Var9 + 2));
            std::__cxx11::string::substr((ulong)&local_110,(ulong)command);
            if (local_110._M_string_length == local_148._M_string_length) {
              if (local_110._M_string_length == 0) {
                bVar2 = true;
              }
              else {
                iVar5 = bcmp(local_110._M_dataplus._M_p,local_148._M_dataplus._M_p,
                             local_110._M_string_length);
                bVar2 = iVar5 == 0;
              }
            }
            else {
              bVar2 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            local_124 = 0;
            p_Var10 = local_120;
            if (bVar2) {
              iVar5 = (*from->_vptr_Command_Source[4])(from);
              iVar8 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                              *)(CONCAT44(extraout_var_01,iVar5) + 0x1f0),(key_type *)(p_Var9 + 2));
              (*from->_vptr_Command_Source[4])(from);
              if (iVar8.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                  ._M_cur == (__node_type *)0x0) {
                uVar3 = 4;
              }
              else {
                uVar3 = util::variant::GetInt
                                  ((variant *)
                                   ((long)iVar8.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                          ._M_cur + 0x28));
                uVar3 = uVar3 & 0xff;
              }
              uVar4 = (*from->_vptr_Command_Source[*(byte *)((long)&p_Var9[4]._M_right + 1)])(from);
              if (((uVar4 & 0xff) < uVar3) ||
                 ((*(char *)&p_Var9[4]._M_right == '\x01' &&
                  (iVar5 = (*from->_vptr_Command_Source[3])(from),
                  CONCAT44(extraout_var_02,iVar5) == 0)))) {
                local_124 = 4;
                p_Var10 = local_120;
              }
              else {
                p_Var10 = p_Var9;
                if ((_Rb_tree_header *)local_120 != p_Var1) {
                  iVar5 = (*from->_vptr_Command_Source[4])(from);
                  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_110,"unknown_command","");
                  I18N::Format<>(&local_f0,(I18N *)(CONCAT44(extraout_var_03,iVar5) + 0x490),
                                 &local_110);
                  (*from->_vptr_Command_Source[5])(from,&local_f0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                    operator_delete(local_f0._M_dataplus._M_p,
                                    local_f0.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_110._M_dataplus._M_p != &local_110.field_2) {
                    operator_delete(local_110._M_dataplus._M_p,
                                    local_110.field_2._M_allocated_capacity + 1);
                  }
                  local_124 = 1;
                  p_Var10 = local_120;
                }
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            uVar3 = local_124;
            local_120 = p_Var10;
            if ((local_124 & 3) != 0) goto LAB_00129810;
          }
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
          p_Var10 = local_120;
        }
        uVar3 = 2;
LAB_00129810:
        bVar2 = false;
        if (uVar3 == 2) {
          if ((_Rb_tree_header *)p_Var10 == p_Var1) {
            uVar3 = 0;
          }
          else if ((ulong)((long)(local_118->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(local_118->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) <
                   (ulong)((long)p_Var10[3]._M_parent - *(long *)(p_Var10 + 3))) {
            iVar5 = (*from->_vptr_Command_Source[4])(from);
            local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_148,"command_not_enough_arguments","");
            I18N::Format<>(&local_b0,(I18N *)(CONCAT44(extraout_var_06,iVar5) + 0x490),&local_148);
            (*from->_vptr_Command_Source[5])(from,&local_b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            uVar3 = 1;
            bVar2 = false;
          }
          else {
            if (p_Var10[5]._M_left == (_Base_ptr)0x0) goto LAB_001299b0;
            local_148._M_dataplus._M_p = (pointer)from;
            (*(code *)p_Var10[5]._M_right)(p_Var10 + 5,local_118,&local_148);
            bVar2 = true;
            uVar3 = 1;
          }
        }
        bVar11 = uVar3 == 0;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,
                   *(long *)((long)cVar7.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x28),
                   *(long *)((long)cVar7.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x30) +
                   *(long *)((long)cVar7.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                   ._M_cur + 0x28));
        bVar2 = Handle(this,&local_90,local_118,from,alias_depth + 1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar11 = false;
      }
      if (!bVar11) {
        return bVar2;
      }
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unknown_command","");
      I18N::Format<>(&local_d0,(I18N *)(CONCAT44(extraout_var_07,iVar5) + 0x490),&local_148);
      (*from->_vptr_Command_Source[5])(from,&local_d0);
      local_50.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_00129984;
    }
    else {
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      iVar8 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)(CONCAT44(extraout_var_00,iVar5) + 0x1f0),command);
      (*from->_vptr_Command_Source[4])(from);
      if (iVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
          ._M_cur == (__node_type *)0x0) {
        uVar3 = 4;
      }
      else {
        uVar3 = util::variant::GetInt
                          ((variant *)
                           ((long)iVar8.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                  ._M_cur + 0x28));
        uVar3 = uVar3 & 0xff;
      }
      uVar4 = (*from->_vptr_Command_Source[*(byte *)((long)&cVar6._M_node[4]._M_right + 1)])(from);
      if ((uVar3 <= (uVar4 & 0xff)) &&
         ((*(char *)&cVar6._M_node[4]._M_right != '\x01' ||
          (iVar5 = (*from->_vptr_Command_Source[3])(from), CONCAT44(extraout_var_05,iVar5) != 0))))
      {
        if (cVar6._M_node[5]._M_left != (_Base_ptr)0x0) {
          local_148._M_dataplus._M_p = (pointer)from;
          (*(code *)cVar6._M_node[5]._M_right)(cVar6._M_node + 5,local_118,&local_148);
          return true;
        }
LAB_001299b0:
        local_148._M_dataplus._M_p = (pointer)from;
        std::__throw_bad_function_call();
      }
      iVar5 = (*from->_vptr_Command_Source[4])(from);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"unknown_command","");
      I18N::Format<>(&local_70,(I18N *)(CONCAT44(extraout_var_04,iVar5) + 0x490),&local_148);
      (*from->_vptr_Command_Source[5])(from,&local_70);
      local_50.field_2._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_00129984;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
LAB_00129984:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool command_handler_register::Handle(std::string command, const std::vector<std::string>& arguments, Command_Source* from, int alias_depth) const
{
	if (command.empty())
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return false;
	}

	if (alias_depth > 100)
	{
		Console::Wrn("Command alias nested too deeply or infinitely recursive: %s", command.c_str());
		return false;
	}

	auto command_result = handlers.find(command);

	if (command_result != handlers.end() && command_result->second.info.arguments.size() <= arguments.size())
	{
		AdminLevel admin_req = ADMIN_HGM;
		auto admin_result = from->SourceWorld()->admin_config.find(command);

		if (admin_result != from->SourceWorld()->admin_config.end())
			admin_req = AdminLevel(int(admin_result->second));

		int access = command_result->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

		if (access < admin_req || (command_result->second.info.require_character && !from->SourceCharacter()))
		{
			from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
			return false;
		}

		command_result->second.f(arguments, from);
		return true;
	}
	else
	{
		auto alias_result = aliases.find(command);

		if (alias_result != aliases.end())
		{
			return this->Handle(alias_result->second, arguments, from, alias_depth + 1);
		}

		auto match = handlers.end();

		UTIL_CIFOREACH(handlers, handler)
		{
			if (command.length() < handler->second.info.partial_min_chars
			 || command.length() >= handler->second.info.name.length())
				continue;

			std::string prefix = handler->second.info.name.substr(0, std::max(command.length(), handler->second.info.partial_min_chars));

			if (command.substr(0, prefix.length()) == prefix)
			{
				AdminLevel admin_req = ADMIN_HGM;
				auto admin_result = from->SourceWorld()->admin_config.find(handler->second.info.name);

				if (admin_result != from->SourceWorld()->admin_config.end())
					admin_req = AdminLevel(int(admin_result->second));

				int access = handler->second.info.duty_restrict ? from->SourceDutyAccess() : from->SourceAccess();

				if (access < admin_req || (handler->second.info.require_character && !from->SourceCharacter()))
					continue;

				// Ambiguous abbreviation
				if (match != handlers.end())
				{
					from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
					return false;
				}

				match = handler;
			}
		}

		if (match != handlers.end())
		{
			if (match->second.info.arguments.size() > arguments.size())
			{
				from->ServerMsg(from->SourceWorld()->i18n.Format("command_not_enough_arguments"));
				return false;
			}

			match->second.f(arguments, from);
			return true;
		}
	}

	from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
	return false;
}